

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O2

void __thiscall BailOutRecord::DumpLocalOffsets(BailOutRecord *this,uint count,int argOutSlotStart)

{
  uint uVar1;
  uint uVar2;
  GlobalBailOutRecordDataTable *pGVar3;
  GlobalBailOutRecordDataRow *pGVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  uint uVar8;
  undefined4 in_register_00000014;
  long lVar9;
  undefined4 in_register_00000034;
  int *piVar10;
  ulong uVar11;
  
  pGVar3 = this->globalBailOutRecordTable;
  uVar1 = this->m_bailOutRecordId;
  puVar7 = (undefined4 *)
           __tls_get_addr(&PTR_013e5f18,CONCAT44(in_register_00000034,count),
                          CONCAT44(in_register_00000014,argOutSlotStart));
  lVar9 = 0;
  uVar11 = 0;
  do {
    if (pGVar3->length <= uVar11) {
      return;
    }
    pGVar4 = pGVar3->globalBailOutRecordDataRows;
    if (uVar1 <= *(uint *)((long)&pGVar4->end + lVar9)) {
      if (uVar1 < *(uint *)((long)&pGVar4->start + lVar9)) {
        return;
      }
      piVar10 = (int *)((long)&pGVar4->offset + lVar9);
      if (piVar10 == (int *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x221,"(row != nullptr)","row != nullptr");
        if (!bVar6) goto LAB_003e2047;
        *puVar7 = 0;
      }
      uVar2 = *(uint *)(&pGVar4->field_0xc + lVar9);
      uVar8 = uVar2;
      if (0xbfffffff < uVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                           ,0x226,"(!isFloat64 || !isInt32)","!isFloat64 || !isInt32");
        if (!bVar6) {
LAB_003e2047:
          pcVar5 = (code *)invalidInstructionException();
          (*pcVar5)();
        }
        *puVar7 = 0;
        uVar8 = *(uint *)(&pGVar4->field_0xc + lVar9);
      }
      Output::Print(L"%s #%3d: ",L"Register",(ulong)(uVar8 & 0x3fffffff));
      DumpValue(this,*piVar10,(bool)((byte)(uVar2 >> 0x1e) & 1));
      Output::Print(L"\n");
    }
    uVar11 = uVar11 + 1;
    lVar9 = lVar9 + 0x10;
  } while( true );
}

Assistant:

void BailOutRecord::DumpLocalOffsets(uint count, int argOutSlotStart)
{
    char16 const * name = _u("Register");
    globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow *row) {
        Assert(row != nullptr);

        // The variables below determine whether we have a Var or native float/int.
        bool isFloat64 = row->isFloat;
        bool isInt32 = row->isInt;
        Assert(!isFloat64 || !isInt32);

        Output::Print(_u("%s #%3d: "), name, row->regSlot);
        this->DumpValue(row->offset, isFloat64);
        Output::Print(_u("\n"));
    });
}